

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_2cfb1b::SymlinkTool::configureAttribute
          (SymlinkTool *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  int iVar1;
  char *LHS;
  StringRef name_local;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  
  name_local.Length = name.Length;
  name_local.Data = name.Data;
  if ((name_local.Length == 0x1d) &&
     (iVar1 = bcmp(name_local.Data,"repair-via-ownership-analysis",0x1d), iVar1 == 0)) {
    if (value.Length == 5) {
      iVar1 = bcmp(value.Data,"false",5);
      if (iVar1 == 0) {
        this->repairViaOwnershipAnalysis = false;
        return true;
      }
    }
    else if ((value.Length == 4) && (*(int *)value.Data == 0x65757274)) {
      this->repairViaOwnershipAnalysis = true;
      return true;
    }
    LHS = "invalid value for attribute: \'";
  }
  else {
    LHS = "unexpected attribute: \'";
  }
  llvm::Twine::Twine(&local_50,LHS,&name_local);
  llvm::Twine::Twine(&local_68,"\'");
  llvm::Twine::concat(&local_38,&local_50,&local_68);
  llbuild::buildsystem::ConfigureContext::error(ctx,&local_38);
  return false;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "repair-via-ownership-analysis") {
      if (value == "true") {
        repairViaOwnershipAnalysis = true;
        return true;
      } else if(value == "false") {
        repairViaOwnershipAnalysis = false;
        return true;
      } else {
        ctx.error("invalid value for attribute: '" + name + "'");
        return false;
      }
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
  }